

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O3

void feat_agc(feat_t *fcb,mfcc_t **mfc,int32 nfr,int32 beginutt,int32 endutt)

{
  agc_type_t aVar1;
  agc_type_t aVar2;
  
  aVar1 = fcb->agc;
  aVar2 = AGC_EMAX;
  if (aVar1 == AGC_NONE) {
    aVar2 = aVar1;
  }
  if (endutt == 0) {
    aVar1 = aVar2;
  }
  if (beginutt == 0) {
    aVar1 = aVar2;
  }
  if (aVar1 != AGC_NOISE) {
    if (aVar1 == AGC_EMAX) {
      agc_emax(fcb->agc_struct,mfc,nfr);
      if (endutt != 0) {
        agc_emax_update(fcb->agc_struct);
        return;
      }
    }
    else if (aVar1 == AGC_MAX) {
      agc_max(fcb->agc_struct,mfc,nfr);
      return;
    }
    return;
  }
  agc_noise(fcb->agc_struct,mfc,nfr);
  return;
}

Assistant:

static void
feat_agc(feat_t *fcb, mfcc_t **mfc, int32 nfr, int32 beginutt, int32 endutt)
{
    agc_type_t agc_type = fcb->agc;

    if (!(beginutt && endutt)
        && agc_type != AGC_NONE) /* Only agc_emax in block computation mode. */
        agc_type = AGC_EMAX;

    switch (agc_type) {
    case AGC_MAX:
        agc_max(fcb->agc_struct, mfc, nfr);
        break;
    case AGC_EMAX:
        agc_emax(fcb->agc_struct, mfc, nfr);
        if (endutt)
            agc_emax_update(fcb->agc_struct);
        break;
    case AGC_NOISE:
        agc_noise(fcb->agc_struct, mfc, nfr);
        break;
    default:
        ;
    }
    cep_dump_dbg(fcb, mfc, nfr, "After AGC");
}